

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O0

int __thiscall Fl_GTK_File_Chooser::fl_gtk_chooser_wrapper(Fl_GTK_File_Chooser *this)

{
  GtkFileChooser *pGVar1;
  undefined1 auVar2 [16];
  XX_gtk_file_chooser_set_current_name p_Var3;
  XX_gtk_file_filter_add_custom p_Var4;
  Display *pDVar5;
  int iVar6;
  gboolean gVar7;
  guint gVar8;
  GtkWidget *pGVar9;
  char *pcVar10;
  ulong uVar11;
  GtkFileFilter *pGVar12;
  pair *this_00;
  Window WVar13;
  Window WVar14;
  Fl_Window *pFVar15;
  gchar *pgVar16;
  GSList *pGVar17;
  long *local_200;
  int local_1e4;
  char *local_198;
  long *local_168;
  GSList *iter;
  GtkFileFilter *gfilter_1;
  Window xid;
  XEvent xevent;
  gint response_id;
  gboolean state;
  Window xw;
  GdkWindow *gdkw;
  Fl_Window *firstw;
  GtkWidget *toggle;
  GtkFileFilter *gfilter;
  char *local_50;
  char *q;
  char *pcStack_40;
  int count;
  char *filter;
  GtkFileFilter **filter_tab;
  GtkFileChooserAction gtw_action_type;
  int ac;
  char *p;
  Fl_GTK_File_Chooser *pFStack_18;
  int result;
  Fl_GTK_File_Chooser *this_local;
  
  p._4_4_ = 1;
  pFStack_18 = this;
  if (fl_gtk_chooser_wrapper::have_gtk_init == 0) {
    fl_gtk_chooser_wrapper::have_gtk_init = -1;
    filter_tab._4_4_ = 0;
    (*fl_gtk_init_check)((int *)((long)&filter_tab + 4),(char ***)0x0);
  }
  if (this->gtkw_ptr != (GtkWidget *)0x0) {
    (*fl_gtk_widget_destroy)(this->gtkw_ptr);
    this->gtkw_ptr = (GtkWidget *)0x0;
  }
  switch((this->super_Fl_FLTK_File_Chooser)._btype) {
  case 0:
  case 2:
  default:
    filter_tab._0_4_ = GTK_FILE_CHOOSER_ACTION_OPEN;
    break;
  case 1:
  case 3:
    filter_tab._0_4_ = GTK_FILE_CHOOSER_ACTION_SELECT_FOLDER;
    break;
  case 4:
    filter_tab._0_4_ = GTK_FILE_CHOOSER_ACTION_SAVE;
    break;
  case 5:
    filter_tab._0_4_ = GTK_FILE_CHOOSER_ACTION_CREATE_FOLDER;
  }
  if (((GtkFileChooserAction)filter_tab == GTK_FILE_CHOOSER_ACTION_SAVE) ||
     ((GtkFileChooserAction)filter_tab == GTK_FILE_CHOOSER_ACTION_CREATE_FOLDER)) {
    local_198 = "gtk-save";
  }
  else {
    local_198 = "gtk-open";
  }
  pGVar9 = (*fl_gtk_file_chooser_dialog_new)
                     (this->gtkw_title,(GtkWindow *)0x0,(GtkFileChooserAction)filter_tab,
                      "gtk-cancel",0xfffffffa,local_198,0xfffffffd,0);
  this->gtkw_ptr = pGVar9;
  p_Var3 = fl_gtk_file_chooser_set_current_name;
  if (this->gtkw_ptr == (GtkWidget *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    switch((this->super_Fl_FLTK_File_Chooser)._btype) {
    case 0:
    case 1:
      break;
    case 2:
    case 3:
      (*fl_gtk_file_chooser_set_select_multiple)((GtkFileChooser *)this->gtkw_ptr,1);
      break;
    case 4:
      if ((this->super_Fl_FLTK_File_Chooser)._preset_file != (char *)0x0) {
        pGVar1 = (GtkFileChooser *)this->gtkw_ptr;
        pcVar10 = fl_filename_name((this->super_Fl_FLTK_File_Chooser)._preset_file);
        (*p_Var3)(pGVar1,pcVar10);
      }
    case 5:
      (*fl_gtk_file_chooser_set_create_folders)((GtkFileChooser *)this->gtkw_ptr,1);
      (*fl_gtk_file_chooser_set_do_overwrite_confirmation)
                ((GtkFileChooser *)this->gtkw_ptr,
                 (uint)(((this->super_Fl_FLTK_File_Chooser)._options & 1U) != 0));
    }
    if (((this->super_Fl_FLTK_File_Chooser)._directory == (char *)0x0) ||
       (*(this->super_Fl_FLTK_File_Chooser)._directory == '\0')) {
      if (((this->super_Fl_FLTK_File_Chooser)._preset_file != (char *)0x0) &&
         (_gtw_action_type = extract_dir_from_path((this->super_Fl_FLTK_File_Chooser)._preset_file),
         _gtw_action_type != (char *)0x0)) {
        (*fl_gtk_file_chooser_set_current_folder)((GtkFileChooser *)this->gtkw_ptr,_gtw_action_type)
        ;
      }
    }
    else {
      _gtw_action_type = extract_dir_from_path((this->super_Fl_FLTK_File_Chooser)._directory);
      if (_gtw_action_type != (char *)0x0) {
        (*fl_gtk_file_chooser_set_current_folder)((GtkFileChooser *)this->gtkw_ptr,_gtw_action_type)
        ;
      }
    }
    filter = (char *)0x0;
    if ((this->super_Fl_FLTK_File_Chooser)._parsedfilt != (char *)0x0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(this->super_Fl_FLTK_File_Chooser)._nfilters;
      uVar11 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      filter = (char *)operator_new__(uVar11);
      pcStack_40 = strdup((this->super_Fl_FLTK_File_Chooser)._parsedfilt);
      _gtw_action_type = strtok(pcStack_40,"\t");
      q._4_4_ = 0;
      while (_gtw_action_type != (char *)0x0) {
        pGVar12 = (*fl_gtk_file_filter_new)();
        *(GtkFileFilter **)(filter + (long)q._4_4_ * 8) = pGVar12;
        (*fl_gtk_file_filter_set_name)
                  (*(GtkFileFilter **)(filter + (long)q._4_4_ * 8),_gtw_action_type);
        _gtw_action_type = strchr(_gtw_action_type,0x28);
        _gtw_action_type = _gtw_action_type + 1;
        local_50 = strchr(_gtw_action_type,0x29);
        *local_50 = '\0';
        p_Var4 = fl_gtk_file_filter_add_custom;
        pGVar12 = *(GtkFileFilter **)(filter + (long)q._4_4_ * 8);
        this_00 = (pair *)operator_new(0x10);
        pair::pair(this_00,this,_gtw_action_type);
        (*p_Var4)(pGVar12,GTK_FILE_FILTER_FILENAME,custom_gtk_filter_function,this_00,free_pair);
        (*fl_gtk_file_chooser_add_filter)
                  ((GtkFileChooser *)this->gtkw_ptr,*(GtkFileFilter **)(filter + (long)q._4_4_ * 8))
        ;
        _gtw_action_type = strtok((char *)0x0,"\t");
        q._4_4_ = q._4_4_ + 1;
      }
      free(pcStack_40);
      if ((this->super_Fl_FLTK_File_Chooser)._filtvalue <
          (this->super_Fl_FLTK_File_Chooser)._nfilters) {
        local_1e4 = (this->super_Fl_FLTK_File_Chooser)._filtvalue;
      }
      else {
        local_1e4 = 0;
      }
      (*fl_gtk_file_chooser_set_filter)
                ((GtkFileChooser *)this->gtkw_ptr,*(GtkFileFilter **)(filter + (long)local_1e4 * 8))
      ;
      this->previous_filter = (char *)0x0;
      if ((GtkFileChooserAction)filter_tab == GTK_FILE_CHOOSER_ACTION_OPEN) {
        toggle = (GtkWidget *)(*fl_gtk_file_filter_new)();
        (*fl_gtk_file_filter_set_name)((GtkFileFilter *)toggle,Fl_File_Chooser::all_files_label);
        (*fl_gtk_file_filter_add_pattern)((GtkFileFilter *)toggle,"*");
        (*fl_gtk_file_chooser_add_filter)((GtkFileChooser *)this->gtkw_ptr,(GtkFileFilter *)toggle);
      }
    }
    firstw = (Fl_Window *)(*fl_gtk_check_button_new_with_label)(Fl_File_Chooser::hidden_label);
    (*fl_gtk_file_chooser_set_extra_widget)((GtkFileChooser *)this->gtkw_ptr,(GtkWidget *)firstw);
    (*fl_g_signal_connect_data)
              (firstw,"toggled",hidden_files_cb,this->gtkw_ptr,(GClosureNotify)0x0,0);
    gdkw = (GdkWindow *)Fl::first_window();
    (*fl_gtk_widget_show_now)(this->gtkw_ptr);
    if (gdkw != (GdkWindow *)0x0) {
      xw = (Window)(*fl_gtk_widget_get_window)(this->gtkw_ptr);
      WVar13 = (*fl_gdk_x11_drawable_get_xid)((GdkWindow *)xw);
      pDVar5 = fl_display;
      _response_id = WVar13;
      WVar14 = fl_xid((Fl_Window *)gdkw);
      XSetTransientForHint(pDVar5,WVar13,WVar14);
    }
    xevent.pad[0x17]._4_4_ =
         (*fl_gtk_file_chooser_get_show_hidden)((GtkFileChooser *)this->gtkw_ptr);
    (*fl_gtk_toggle_button_set_active)((GtkToggleButton *)firstw,xevent.pad[0x17]._4_4_);
    xevent.pad[0x17]._0_4_ = 0xffffffff;
    (*fl_g_signal_connect_data)
              (this->gtkw_ptr,"response",run_response_handler,xevent.pad + 0x17,(GClosureNotify)0x0,
               0);
    while (xevent.pad[0x17]._0_4_ == -1) {
      (*fl_gtk_main_iteration)();
      while (iVar6 = XEventsQueued(fl_display,1), iVar6 != 0) {
        XNextEvent(fl_display,&xid);
        gfilter_1 = (GtkFileFilter *)xevent.xany.display;
        if ((int)xid == 0x16) {
          gfilter_1 = (GtkFileFilter *)xevent.xany.window;
        }
        pFVar15 = fl_find((Window)gfilter_1);
        if ((pFVar15 != (Fl_Window *)0x0) && (((int)xid == 0xc || ((int)xid == 0x16)))) {
          fl_handle((XEvent *)&xid);
        }
      }
      Fl::flush();
    }
    if (xevent.pad[0x17]._0_4_ == -3) {
      if ((this->super_Fl_FLTK_File_Chooser)._parsedfilt != (char *)0x0) {
        pGVar12 = (*fl_gtk_file_chooser_get_filter)((GtkFileChooser *)this->gtkw_ptr);
        (this->super_Fl_FLTK_File_Chooser)._filtvalue = 0;
        while (((this->super_Fl_FLTK_File_Chooser)._filtvalue <
                (this->super_Fl_FLTK_File_Chooser)._nfilters &&
               (*(GtkFileFilter **)
                 (filter + (long)(this->super_Fl_FLTK_File_Chooser)._filtvalue * 8) != pGVar12))) {
          (this->super_Fl_FLTK_File_Chooser)._filtvalue =
               (this->super_Fl_FLTK_File_Chooser)._filtvalue + 1;
        }
      }
      if (this->gtkw_filename != (char *)0x0) {
        (*fl_g_free)(this->gtkw_filename);
        this->gtkw_filename = (char *)0x0;
      }
      if (this->gtkw_slist != (void *)0x0) {
        local_168 = (long *)this->gtkw_slist;
        while (local_168 != (long *)0x0) {
          if (*local_168 != 0) {
            (*fl_g_free)((gpointer)*local_168);
          }
          if (local_168 == (long *)0x0) {
            local_200 = (long *)0x0;
          }
          else {
            local_200 = (long *)local_168[1];
          }
          local_168 = local_200;
        }
        (*fl_g_slist_free)((GSList *)this->gtkw_slist);
        this->gtkw_slist = (void *)0x0;
      }
      this->gtkw_count = 0;
      gVar7 = (*fl_gtk_file_chooser_get_select_multiple)((GtkFileChooser *)this->gtkw_ptr);
      if (gVar7 == 0) {
        pgVar16 = (*fl_gtk_file_chooser_get_filename)((GtkFileChooser *)this->gtkw_ptr);
        this->gtkw_filename = pgVar16;
        if (this->gtkw_filename != (char *)0x0) {
          this->gtkw_count = 1;
          p._4_4_ = 0;
        }
      }
      else {
        pGVar17 = (*fl_gtk_file_chooser_get_filenames)((GtkFileChooser *)this->gtkw_ptr);
        this->gtkw_slist = pGVar17;
        gVar8 = (*fl_g_slist_length)((GSList *)this->gtkw_slist);
        this->gtkw_count = gVar8;
        if (this->gtkw_count != 0) {
          p._4_4_ = 0;
        }
      }
    }
    if (filter != (char *)0x0) {
      operator_delete__(filter);
    }
    if (xevent.pad[0x17]._0_4_ == -4) {
      this->gtkw_ptr = (GtkWidget *)0x0;
    }
    else {
      (*fl_gtk_widget_hide)(this->gtkw_ptr);
    }
    while (gVar7 = (*fl_gtk_events_pending)(), gVar7 != 0) {
      (*fl_gtk_main_iteration)();
    }
    this_local._4_4_ = p._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_GTK_File_Chooser::fl_gtk_chooser_wrapper()
{
  int result = 1;
  static int have_gtk_init = 0;
  char *p;
  
  if(!have_gtk_init) {
    have_gtk_init = -1;
    int ac = 0;
    fl_gtk_init_check(&ac, NULL);
  }
  
  if(gtkw_ptr) { // discard the previous dialog widget
    fl_gtk_widget_destroy (gtkw_ptr);
    gtkw_ptr = NULL;
  }
  
  // set the dialog action type
  GtkFileChooserAction gtw_action_type;
  switch (_btype) {
    case Fl_Native_File_Chooser::BROWSE_DIRECTORY:
    case Fl_Native_File_Chooser::BROWSE_MULTI_DIRECTORY:
      gtw_action_type = GTK_FILE_CHOOSER_ACTION_SELECT_FOLDER;
      break;
      
    case Fl_Native_File_Chooser::BROWSE_SAVE_FILE:
      gtw_action_type = GTK_FILE_CHOOSER_ACTION_SAVE;
      break;
      
    case Fl_Native_File_Chooser::BROWSE_SAVE_DIRECTORY:
      gtw_action_type = GTK_FILE_CHOOSER_ACTION_CREATE_FOLDER;
      break;
      
    case Fl_Native_File_Chooser::BROWSE_MULTI_FILE:
    case Fl_Native_File_Chooser::BROWSE_FILE:
    default:
      gtw_action_type = GTK_FILE_CHOOSER_ACTION_OPEN;
      break;
  }
  // create a new dialog
  gtkw_ptr = fl_gtk_file_chooser_dialog_new (gtkw_title,
					     NULL, /* parent_window */
					     gtw_action_type,
					     GTK_STOCK_CANCEL, GTK_RESPONSE_CANCEL,
					     gtw_action_type == GTK_FILE_CHOOSER_ACTION_SAVE || gtw_action_type == GTK_FILE_CHOOSER_ACTION_CREATE_FOLDER ? 
					     GTK_STOCK_SAVE : GTK_STOCK_OPEN, 
					     GTK_RESPONSE_ACCEPT,
					     NULL);
  // did we create a valid dialog widget?
  if(!gtkw_ptr) {
    // fail
    return -1;
  }
  
  // set the dialog properties
  switch (_btype) {
    case Fl_Native_File_Chooser::BROWSE_MULTI_DIRECTORY:
    case Fl_Native_File_Chooser::BROWSE_MULTI_FILE:
      fl_gtk_file_chooser_set_select_multiple((GtkFileChooser *)gtkw_ptr, TRUE);
      break;
      
    case Fl_Native_File_Chooser::BROWSE_SAVE_FILE:
      if (_preset_file)fl_gtk_file_chooser_set_current_name ((GtkFileChooser *)gtkw_ptr, fl_filename_name(_preset_file));
      /* FALLTHROUGH */
    case Fl_Native_File_Chooser::BROWSE_SAVE_DIRECTORY:
      fl_gtk_file_chooser_set_create_folders((GtkFileChooser *)gtkw_ptr, TRUE);
      fl_gtk_file_chooser_set_do_overwrite_confirmation ((GtkFileChooser *)gtkw_ptr, (_options & Fl_Native_File_Chooser::SAVEAS_CONFIRM)?TRUE:FALSE);
      break;
      
    case Fl_Native_File_Chooser::BROWSE_DIRECTORY:
    case Fl_Native_File_Chooser::BROWSE_FILE:
    default:
      break;
  }
  
  if (_directory && _directory[0]) {
    p = extract_dir_from_path(_directory);
    if (p) fl_gtk_file_chooser_set_current_folder((GtkFileChooser *)gtkw_ptr, p);
  }
  else if (_preset_file) {
    p = extract_dir_from_path(_preset_file);
    if (p) fl_gtk_file_chooser_set_current_folder((GtkFileChooser *)gtkw_ptr, p);
  }
  
  GtkFileFilter **filter_tab = NULL;
  if (_parsedfilt) {
    filter_tab = new GtkFileFilter*[_nfilters];
    char *filter = strdup(_parsedfilt);
    p = strtok(filter, "\t");
    int count = 0;
    while (p) {
      filter_tab[count] = fl_gtk_file_filter_new();
      fl_gtk_file_filter_set_name(filter_tab[count], p);
      p = strchr(p, '(') + 1;
      char *q = strchr(p, ')'); *q = 0;
      fl_gtk_file_filter_add_custom(filter_tab[count], 
				    GTK_FILE_FILTER_FILENAME, 
				    (GtkFileFilterFunc)Fl_GTK_File_Chooser::custom_gtk_filter_function, 
				    new Fl_GTK_File_Chooser::pair(this, p), 
				    (GDestroyNotify)Fl_GTK_File_Chooser::free_pair);
      fl_gtk_file_chooser_add_filter((GtkFileChooser *)gtkw_ptr, filter_tab[count]);
      p = strtok(NULL, "\t");
      count++;
    }
    free(filter);
    fl_gtk_file_chooser_set_filter((GtkFileChooser *)gtkw_ptr, filter_tab[_filtvalue < _nfilters?_filtvalue:0]);
    previous_filter = NULL;
    if (gtw_action_type == GTK_FILE_CHOOSER_ACTION_OPEN) {
      GtkFileFilter* gfilter = fl_gtk_file_filter_new();
      fl_gtk_file_filter_set_name(gfilter, Fl_File_Chooser::all_files_label);
      fl_gtk_file_filter_add_pattern(gfilter, "*");
      fl_gtk_file_chooser_add_filter((GtkFileChooser *)gtkw_ptr, gfilter);
    }
  }
  
  GtkWidget *toggle = fl_gtk_check_button_new_with_label(Fl_File_Chooser::hidden_label);
  fl_gtk_file_chooser_set_extra_widget((GtkFileChooser *)gtkw_ptr, toggle);
  fl_g_signal_connect_data(toggle, "toggled", G_CALLBACK(hidden_files_cb), gtkw_ptr, NULL, (GConnectFlags) 0);
  Fl_Window* firstw = Fl::first_window();
  fl_gtk_widget_show_now(gtkw_ptr); // map the GTK window on screen
  if (firstw) {
    GdkWindow* gdkw = fl_gtk_widget_get_window(gtkw_ptr);
    Window xw = fl_gdk_x11_drawable_get_xid(gdkw); // get the X11 ref of the GTK window
    XSetTransientForHint(fl_display, xw, fl_xid(firstw)); // set the GTK window transient for the last FLTK win
    }
  gboolean state = fl_gtk_file_chooser_get_show_hidden((GtkFileChooser *)gtkw_ptr);
  fl_gtk_toggle_button_set_active((GtkToggleButton *)toggle, state);
  
  gint response_id = GTK_RESPONSE_NONE;
  fl_g_signal_connect_data(gtkw_ptr, "response", G_CALLBACK(run_response_handler), &response_id, NULL, (GConnectFlags) 0);
  while (response_id == GTK_RESPONSE_NONE) { // loop that shows the GTK dialog window
    fl_gtk_main_iteration(); // one iteration of the GTK event loop
    while (XEventsQueued(fl_display, QueuedAfterReading)) { // emulate modal dialog
      XEvent xevent;
      XNextEvent(fl_display, &xevent);
      Window xid = xevent.xany.window;
      if (xevent.type == ConfigureNotify) xid = xevent.xmaprequest.window;
      if (!fl_find(xid)) continue; // skip events to non-FLTK windows
      // process Expose and ConfigureNotify events
      if ( xevent.type == Expose || xevent.type == ConfigureNotify ) fl_handle(xevent); 
    }
    Fl::flush(); // do the drawings needed after Expose events
  } 
  
  if (response_id == GTK_RESPONSE_ACCEPT) {
    if (_parsedfilt) {
      GtkFileFilter *gfilter = fl_gtk_file_chooser_get_filter((GtkFileChooser *)gtkw_ptr);
      for (_filtvalue = 0; _filtvalue < _nfilters; _filtvalue++) {
	if (filter_tab[_filtvalue] == gfilter) break;
      }
    }
    
    // discard any filenames or lists from previous calls
    if(gtkw_filename) {
      fl_g_free(gtkw_filename);
      gtkw_filename = NULL;
    }
    if(gtkw_slist) {
      GSList *iter = (GSList *)gtkw_slist;
      while(iter) {
        if(iter->data) fl_g_free(iter->data);
        iter = g_slist_next(iter);
      }
      fl_g_slist_free((GSList *)gtkw_slist);
      gtkw_slist = NULL;
    }
    gtkw_count = 0; // assume we have no files selected now
    
    if(fl_gtk_file_chooser_get_select_multiple((GtkFileChooser *)gtkw_ptr) == FALSE) {
      gtkw_filename = fl_gtk_file_chooser_get_filename ((GtkFileChooser *)gtkw_ptr);
      if (gtkw_filename) {
        gtkw_count = 1;
        result = 0;
        //printf("single: %s\n", gtkw_filename);
      }
    }
    else {
      gtkw_slist = fl_gtk_file_chooser_get_filenames((GtkFileChooser *)gtkw_ptr);
      gtkw_count = fl_g_slist_length((GSList *)gtkw_slist);
      if(gtkw_count) result = 0;
      
      //      puts("multiple");
      //      GSList *iter = (GSList *)gtkw_slist;
      //      printf ("Selected %d files\n", gtkw_count);
      //      while(iter) {
      //        char *nm = (char *)iter->data;
      //        printf("%s\n", nm);
      //        iter = g_slist_next(iter);
      //      }
    }
  }
  delete[] filter_tab;
  if ( response_id == GTK_RESPONSE_DELETE_EVENT) gtkw_ptr = NULL;
  else fl_gtk_widget_hide (gtkw_ptr);
  
  // I think this is analogus to doing an Fl::check() - we need this here to make sure
  // the GtkFileChooserDialog is removed from the display correctly
  while (fl_gtk_events_pending ()) fl_gtk_main_iteration (); 
  
  return result;
}